

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsSamplers.h
# Opt level: O2

default_random_engine * chrono::utils::rengine(void)

{
  int iVar1;
  
  if (rengine()::re == '\0') {
    iVar1 = __cxa_guard_acquire(&rengine()::re);
    if (iVar1 != 0) {
      rengine::re = (default_random_engine *)::operator_new(8);
      rengine::re->_M_x = 1;
      __cxa_guard_release(&rengine()::re);
    }
  }
  return rengine::re;
}

Assistant:

inline std::default_random_engine& rengine() {
    static std::default_random_engine* re = new std::default_random_engine;
    return *re;
}